

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.h
# Opt level: O1

color * __thiscall
image_texture::value(color *__return_storage_ptr__,image_texture *this,double u,double v,point3 *p)

{
  float *pfVar1;
  int iVar2;
  byte *pbVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  pfVar1 = (this->image).fdata;
  iVar2 = 0;
  if (pfVar1 != (float *)0x0) {
    iVar2 = (this->image).image_height;
  }
  if (iVar2 < 1) {
    dVar5 = 1.0;
    dVar4 = 0.0;
    dVar6 = 1.0;
  }
  else {
    dVar6 = 0.0;
    dVar4 = 1.0;
    if (v <= 1.0) {
      dVar4 = v;
    }
    dVar5 = 1.0;
    if (u <= 1.0) {
      dVar5 = u;
    }
    if (pfVar1 != (float *)0x0) {
      dVar6 = (double)(this->image).image_width;
    }
    pbVar3 = rtw_image::pixel_data
                       (&this->image,(int)((double)(~-(ulong)(u < 0.0) & (ulong)dVar5) * dVar6),
                        (int)((double)(-(ulong)(v < 0.0) & 0x3ff0000000000000 |
                                      ~-(ulong)(v < 0.0) & (ulong)(1.0 - dVar4)) * (double)iVar2));
    dVar4 = (double)*pbVar3 * 0.00392156862745098;
    dVar5 = (double)pbVar3[1] * 0.00392156862745098;
    dVar6 = (double)pbVar3[2] * 0.00392156862745098;
  }
  __return_storage_ptr__->e[0] = dVar4;
  __return_storage_ptr__->e[1] = dVar5;
  __return_storage_ptr__->e[2] = dVar6;
  return __return_storage_ptr__;
}

Assistant:

color value(double u, double v, const point3& p) const override {
        // If we have no texture data, then return solid cyan as a debugging aid.
        if (image.height() <= 0) return color(0,1,1);

        // Clamp input texture coordinates to [0,1] x [1,0]
        u = interval(0,1).clamp(u);
        v = 1.0 - interval(0,1).clamp(v);  // Flip V to image coordinates

        auto i = int(u * image.width());
        auto j = int(v * image.height());
        auto pixel = image.pixel_data(i,j);

        auto color_scale = 1.0 / 255.0;
        return color(color_scale*pixel[0], color_scale*pixel[1], color_scale*pixel[2]);
    }